

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

void setTransportProtocol
               (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData,TRANSPORT_PROVIDER *protocol)

{
  TRANSPORT_PROVIDER *protocol_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData_local;
  
  handleData->IoTHubTransport_SendMessageDisposition =
       protocol->IoTHubTransport_SendMessageDisposition;
  handleData->IoTHubTransport_GetHostname = protocol->IoTHubTransport_GetHostname;
  handleData->IoTHubTransport_SetOption = protocol->IoTHubTransport_SetOption;
  handleData->IoTHubTransport_Create = protocol->IoTHubTransport_Create;
  handleData->IoTHubTransport_Destroy = protocol->IoTHubTransport_Destroy;
  handleData->IoTHubTransport_Register = protocol->IoTHubTransport_Register;
  handleData->IoTHubTransport_Unregister = protocol->IoTHubTransport_Unregister;
  handleData->IoTHubTransport_Subscribe = protocol->IoTHubTransport_Subscribe;
  handleData->IoTHubTransport_Unsubscribe = protocol->IoTHubTransport_Unsubscribe;
  handleData->IoTHubTransport_DoWork = protocol->IoTHubTransport_DoWork;
  handleData->IoTHubTransport_SetRetryPolicy = protocol->IoTHubTransport_SetRetryPolicy;
  handleData->IoTHubTransport_GetSendStatus = protocol->IoTHubTransport_GetSendStatus;
  handleData->IoTHubTransport_ProcessItem = protocol->IoTHubTransport_ProcessItem;
  handleData->IoTHubTransport_Subscribe_DeviceTwin = protocol->IoTHubTransport_Subscribe_DeviceTwin;
  handleData->IoTHubTransport_Unsubscribe_DeviceTwin =
       protocol->IoTHubTransport_Unsubscribe_DeviceTwin;
  handleData->IoTHubTransport_GetTwinAsync = protocol->IoTHubTransport_GetTwinAsync;
  handleData->IoTHubTransport_Subscribe_DeviceMethod =
       protocol->IoTHubTransport_Subscribe_DeviceMethod;
  handleData->IoTHubTransport_Unsubscribe_DeviceMethod =
       protocol->IoTHubTransport_Unsubscribe_DeviceMethod;
  handleData->IoTHubTransport_DeviceMethod_Response =
       protocol->IoTHubTransport_DeviceMethod_Response;
  handleData->IoTHubTransport_Subscribe_InputQueue = protocol->IoTHubTransport_Subscribe_InputQueue;
  handleData->IoTHubTransport_Unsubscribe_InputQueue =
       protocol->IoTHubTransport_Unsubscribe_InputQueue;
  handleData->IoTHubTransport_SetCallbackContext = protocol->IoTHubTransport_SetCallbackContext;
  handleData->IoTHubTransport_GetSupportedPlatformInfo =
       protocol->IoTHubTransport_GetSupportedPlatformInfo;
  return;
}

Assistant:

static void setTransportProtocol(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData, TRANSPORT_PROVIDER* protocol)
{
    handleData->IoTHubTransport_SendMessageDisposition = protocol->IoTHubTransport_SendMessageDisposition;
    handleData->IoTHubTransport_GetHostname = protocol->IoTHubTransport_GetHostname;
    handleData->IoTHubTransport_SetOption = protocol->IoTHubTransport_SetOption;
    handleData->IoTHubTransport_Create = protocol->IoTHubTransport_Create;
    handleData->IoTHubTransport_Destroy = protocol->IoTHubTransport_Destroy;
    handleData->IoTHubTransport_Register = protocol->IoTHubTransport_Register;
    handleData->IoTHubTransport_Unregister = protocol->IoTHubTransport_Unregister;
    handleData->IoTHubTransport_Subscribe = protocol->IoTHubTransport_Subscribe;
    handleData->IoTHubTransport_Unsubscribe = protocol->IoTHubTransport_Unsubscribe;
    handleData->IoTHubTransport_DoWork = protocol->IoTHubTransport_DoWork;
    handleData->IoTHubTransport_SetRetryPolicy = protocol->IoTHubTransport_SetRetryPolicy;
    handleData->IoTHubTransport_GetSendStatus = protocol->IoTHubTransport_GetSendStatus;
    handleData->IoTHubTransport_ProcessItem = protocol->IoTHubTransport_ProcessItem;
    handleData->IoTHubTransport_Subscribe_DeviceTwin = protocol->IoTHubTransport_Subscribe_DeviceTwin;
    handleData->IoTHubTransport_Unsubscribe_DeviceTwin = protocol->IoTHubTransport_Unsubscribe_DeviceTwin;
    handleData->IoTHubTransport_GetTwinAsync = protocol->IoTHubTransport_GetTwinAsync;
    handleData->IoTHubTransport_Subscribe_DeviceMethod = protocol->IoTHubTransport_Subscribe_DeviceMethod;
    handleData->IoTHubTransport_Unsubscribe_DeviceMethod = protocol->IoTHubTransport_Unsubscribe_DeviceMethod;
    handleData->IoTHubTransport_DeviceMethod_Response = protocol->IoTHubTransport_DeviceMethod_Response;
    handleData->IoTHubTransport_Subscribe_InputQueue = protocol->IoTHubTransport_Subscribe_InputQueue;
    handleData->IoTHubTransport_Unsubscribe_InputQueue = protocol->IoTHubTransport_Unsubscribe_InputQueue;
    handleData->IoTHubTransport_SetCallbackContext = protocol->IoTHubTransport_SetCallbackContext;
    handleData->IoTHubTransport_GetSupportedPlatformInfo = protocol->IoTHubTransport_GetSupportedPlatformInfo;
}